

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O2

uint8_t * quicly_encode_ack_frame
                    (uint8_t *dst,uint8_t *dst_end,quicly_ranges_t *ranges,uint64_t ack_delay)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  uint __line;
  uint8_t *puVar4;
  char *__assertion;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  sVar1 = ranges->num_ranges;
  if (sVar1 == 0) {
    __assertion = "ranges->num_ranges != 0";
    __line = 0x2f;
  }
  else {
    lVar6 = sVar1 - 1;
    *dst = '\x02';
    puVar4 = ptls_encode_quicint(dst + 1,ranges->ranges[lVar6].end - 1);
    puVar4 = ptls_encode_quicint(puVar4,ack_delay);
    *puVar4 = (char)ranges->num_ranges + 0xff;
    puVar4 = puVar4 + 1;
    lVar5 = sVar1 << 4;
    while( true ) {
      uVar2 = *(ulong *)((long)&ranges->ranges[-1].start + lVar5);
      uVar3 = *(ulong *)((long)ranges->ranges + lVar5 + -8);
      if (uVar3 <= uVar2) break;
      if ((long)dst_end - (long)puVar4 < 8) {
        return (uint8_t *)0x0;
      }
      puVar4 = ptls_encode_quicint(puVar4,uVar3 + ~uVar2);
      bVar7 = lVar6 == 0;
      lVar6 = lVar6 + -1;
      if (bVar7) {
        return puVar4;
      }
      uVar2 = *(ulong *)((long)ranges->ranges + lVar5 + -0x18);
      uVar3 = *(ulong *)((long)&ranges->ranges[-1].start + lVar5);
      if (uVar3 <= uVar2) {
        __assertion = "_start < _end";
        __line = 0x3c;
        goto LAB_0012178b;
      }
      if ((long)dst_end - (long)puVar4 < 8) {
        return (uint8_t *)0x0;
      }
      puVar4 = ptls_encode_quicint(puVar4,uVar3 + ~uVar2);
      lVar5 = lVar5 + -0x10;
    }
    __assertion = "_start < _end";
    __line = 0x39;
  }
LAB_0012178b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/frame.c"
                ,__line,
                "uint8_t *quicly_encode_ack_frame(uint8_t *, uint8_t *, quicly_ranges_t *, uint64_t)"
               );
}

Assistant:

uint8_t *quicly_encode_ack_frame(uint8_t *dst, uint8_t *dst_end, quicly_ranges_t *ranges, uint64_t ack_delay)
{
#define WRITE_BLOCK(start, end)                                                                                                    \
    do {                                                                                                                           \
        uint64_t _start = (start), _end = (end);                                                                                   \
        assert(_start < _end);                                                                                                     \
        if (dst_end - dst < 8)                                                                                                     \
            return NULL;                                                                                                           \
        dst = quicly_encodev(dst, _end - _start - 1);                                                                              \
    } while (0)

    size_t range_index = ranges->num_ranges - 1;

    assert(ranges->num_ranges != 0);

    /* number of bytes being emitted without space check are 1 + 8 + 8 + 1 bytes (as defined in QUICLY_ACK_FRAME_CAPACITY) */
    *dst++ = QUICLY_FRAME_TYPE_ACK;
    dst = quicly_encodev(dst, ranges->ranges[range_index].end - 1); /* largest acknowledged */
    dst = quicly_encodev(dst, ack_delay);                           /* ack delay */
    PTLS_BUILD_ASSERT(QUICLY_MAX_ACK_BLOCKS - 1 <= 63);
    *dst++ = (uint8_t)(ranges->num_ranges - 1); /* ack blocks */

    while (1) {
        WRITE_BLOCK(ranges->ranges[range_index].start, ranges->ranges[range_index].end); /* ACK block count */
        if (range_index-- == 0)
            break;
        WRITE_BLOCK(ranges->ranges[range_index].end, ranges->ranges[range_index + 1].start);
    }

    return dst;

#undef WRITE_BLOCK
}